

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowCustomAggregator::Finalize
          (WindowCustomAggregator *this,WindowAggregatorState *gstate,WindowAggregatorState *lstate,
          CollectionPtr collection,FrameStats *stats)

{
  idx_t *__mutex;
  reallocate_function_ptr_t *mask;
  idx_t *this_00;
  Allocator *pAVar1;
  size_type *psVar2;
  size_type __n;
  ClientContext *context;
  WindowPartitionInput *__ptr;
  aggregate_wininit_t p_Var3;
  WindowCustomAggregator *pWVar4;
  int iVar5;
  reference pvVar6;
  WindowPartitionInput *this_01;
  type pWVar7;
  FunctionDataWrapper *pFVar8;
  type pWVar9;
  size_type *psVar10;
  WindowAggregatorLocalState *lastate;
  WindowAggregatorGlobalState *gasink;
  CollectionPtr collection_local;
  vector<bool,_std::allocator<bool>_> local_90;
  idx_t local_68;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_60;
  FrameStats *local_58;
  WindowCustomAggregator *local_50;
  AggregateInputData aggr_input_data;
  
  __mutex = &gstate[5].allocator.allocated_size;
  collection_local = collection;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    if (gstate[6].allocator.arena_allocator.allocate_function == (allocate_function_ptr_t)0x0) {
      (*lstate->_vptr_WindowAggregatorState[2])(lstate,gstate,collection_local.ptr);
      optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&collection_local);
      local_60._M_head_impl =
           ((collection_local.ptr)->inputs).
           super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
           .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
      local_58 = stats;
      optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&collection_local);
      local_68 = (collection_local.ptr)->count;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      psVar10 = (this->super_WindowAggregator).child_idx.
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      psVar2 = (this->super_WindowAggregator).child_idx.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_50 = this;
      if (psVar10 != psVar2) {
        do {
          __n = *psVar10;
          optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&collection_local);
          pvVar6 = vector<std::atomic<bool>,_true>::operator[]
                             (&(collection_local.ptr)->all_valids,__n);
          ::std::vector<bool,_std::allocator<bool>_>::push_back
                    (&local_90,(bool)((pvVar6->_M_base)._M_i & 1));
          psVar10 = psVar10 + 1;
        } while (psVar10 != psVar2);
      }
      mask = &gstate[6].allocator.arena_allocator.reallocate_function;
      ValidityArray::Pack((ValidityArray *)&gstate[5].allocator.arena_allocator.free_function,
                          (ValidityMask *)mask,
                          (idx_t)gstate[5].allocator.arena_allocator.private_data.
                                 super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                                 .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>.
                                 _M_head_impl);
      context = (ClientContext *)gstate[6].allocator.arena_allocator.free_function;
      this_01 = (WindowPartitionInput *)operator_new(0x80);
      pWVar4 = local_50;
      WindowPartitionInput::WindowPartitionInput
                (this_01,context,local_60._M_head_impl,local_68,
                 &(local_50->super_WindowAggregator).child_idx,(vector<bool,_true> *)&local_90,
                 (ValidityMask *)mask,local_58);
      this_00 = &gstate[7].allocator.initial_capacity;
      __ptr = (WindowPartitionInput *)gstate[7].allocator.initial_capacity;
      gstate[7].allocator.initial_capacity = (idx_t)this_01;
      if (__ptr != (WindowPartitionInput *)0x0) {
        ::std::default_delete<duckdb::WindowPartitionInput>::operator()
                  ((default_delete<duckdb::WindowPartitionInput> *)this_00,__ptr);
      }
      if ((pWVar4->super_WindowAggregator).aggr.function.window_init != (aggregate_wininit_t)0x0) {
        pWVar7 = unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
                 ::operator*((unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
                              *)&gstate[7].allocator);
        if ((pWVar4->super_WindowAggregator).aggr.bind_data_wrapper.internal.
            super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          aggr_input_data.bind_data.ptr = (FunctionData *)0x0;
        }
        else {
          pFVar8 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                             (&(pWVar4->super_WindowAggregator).aggr.bind_data_wrapper);
          aggr_input_data.bind_data.ptr =
               (pFVar8->function_data).
               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
        }
        aggr_input_data.allocator =
             &(pWVar7->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
        aggr_input_data.combine_type = PRESERVE_INPUT;
        p_Var3 = (pWVar4->super_WindowAggregator).aggr.function.window_init;
        pWVar9 = unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                 ::operator*((unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                              *)this_00);
        (*p_Var3)(&aggr_input_data,pWVar9,
                  (pWVar7->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      }
      LOCK();
      pAVar1 = &gstate[6].allocator.arena_allocator;
      pAVar1->allocate_function = pAVar1->allocate_function + 1;
      UNLOCK();
      if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

void WindowCustomAggregator::Finalize(WindowAggregatorState &gstate, WindowAggregatorState &lstate,
                                      CollectionPtr collection, const FrameStats &stats) {
	//	Single threaded Finalize for now
	auto &gcsink = gstate.Cast<WindowCustomAggregatorGlobalState>();
	lock_guard<mutex> gestate_guard(gcsink.lock);
	if (gcsink.finalized) {
		return;
	}

	WindowAggregator::Finalize(gstate, lstate, collection, stats);

	auto inputs = collection->inputs.get();
	const auto count = collection->size();
	vector<bool> all_valids;
	for (auto col_idx : child_idx) {
		all_valids.push_back(collection->all_valids[col_idx]);
	}
	auto &filter_mask = gcsink.filter_mask;
	auto &filter_packed = gcsink.filter_packed;
	filter_mask.Pack(filter_packed, filter_mask.Capacity());

	gcsink.partition_input =
	    make_uniq<WindowPartitionInput>(gcsink.context, inputs, count, child_idx, all_valids, filter_packed, stats);

	if (aggr.function.window_init) {
		auto &gcstate = *gcsink.gcstate;

		AggregateInputData aggr_input_data(aggr.GetFunctionData(), gcstate.allocator);
		aggr.function.window_init(aggr_input_data, *gcsink.partition_input, gcstate.state.data());
	}

	++gcsink.finalized;
}